

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O0

int32_t __thiscall gnilk::IPCBinaryDecoder::ReadStr(IPCBinaryDecoder *this,string *outValue)

{
  char local_21;
  int local_20;
  ushort uStack_1a;
  uint8_t ch;
  int i;
  uint16_t len;
  string *outValue_local;
  IPCBinaryDecoder *this_local;
  
  uStack_1a = 0;
  _i = outValue;
  outValue_local = (string *)this;
  (*(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[10])(this,&stack0xffffffffffffffe6)
  ;
  for (local_20 = 0; local_20 < (int)(uint)uStack_1a; local_20 = local_20 + 1) {
    (*(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[9])(this,&local_21);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (_i,local_21);
  }
  return uStack_1a + 2;
}

Assistant:

int32_t IPCBinaryDecoder::ReadStr(std::string &outValue) {
    uint16_t len = 0;
    ReadU16(len);
    for (int i = 0; i < len; i++) {
        uint8_t ch;
        ReadU8(ch);
        outValue += (char) ch;
    }
    return 2 + len;
}